

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

size_t DataValue_calcSizeBinary(UA_DataValue *src,UA_DataType *_)

{
  size_t local_20;
  size_t s;
  UA_DataType *__local;
  UA_DataValue *src_local;
  
  local_20 = 1;
  if ((undefined1  [96])((undefined1  [96])*src & (undefined1  [96])0x1) != (undefined1  [96])0x0) {
    local_20 = Variant_calcSizeBinary(&src->value,(UA_DataType *)0x0);
    local_20 = local_20 + 1;
  }
  if ((*(byte *)src >> 1 & 1) != 0) {
    local_20 = local_20 + 4;
  }
  if ((*(byte *)src >> 2 & 1) != 0) {
    local_20 = local_20 + 8;
  }
  if ((*(byte *)src >> 4 & 1) != 0) {
    local_20 = local_20 + 2;
  }
  if ((*(byte *)src >> 3 & 1) != 0) {
    local_20 = local_20 + 8;
  }
  if ((*(byte *)src >> 5 & 1) != 0) {
    local_20 = local_20 + 2;
  }
  return local_20;
}

Assistant:

static size_t
DataValue_calcSizeBinary(const UA_DataValue *src, UA_DataType *_) {
    size_t s = 1; // encoding byte
    if(src->hasValue)
        s += Variant_calcSizeBinary(&src->value, NULL);
    if(src->hasStatus)
        s += 4;
    if(src->hasSourceTimestamp)
        s += 8;
    if(src->hasSourcePicoseconds)
        s += 2;
    if(src->hasServerTimestamp)
        s += 8;
    if(src->hasServerPicoseconds)
        s += 2;
    return s;
}